

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

void * setup_temp_malloc(vorb *f,int sz)

{
  char *pcVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  uVar3 = (long)sz + 7U & 0xfffffffffffffff8;
  pcVar1 = (f->alloc).alloc_buffer;
  if (pcVar1 == (char *)0x0) {
    pvVar2 = malloc((long)(int)uVar3);
    return pvVar2;
  }
  lVar5 = (long)f->temp_offset - uVar3;
  iVar4 = (int)lVar5;
  if (iVar4 < f->setup_offset) {
    return (void *)0x0;
  }
  f->temp_offset = iVar4;
  return pcVar1 + lVar5;
}

Assistant:

static void *setup_temp_malloc(vorb *f, int sz)
{
   sz = (sz+7) & ~7; // round up to nearest 8 for alignment of future allocs.
   if (f->alloc.alloc_buffer) {
      if (f->temp_offset - sz < f->setup_offset) return NULL;
      f->temp_offset -= sz;
      return (char *) f->alloc.alloc_buffer + f->temp_offset;
   }
   return malloc(sz);
}